

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::Scope>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,Scope *scope,
               string *warn,string *err,PrimReconstructOptions *options)

{
  _Rb_tree_node_base *__lhs;
  uint uVar1;
  bool bVar2;
  __type _Var3;
  size_type sVar4;
  ostream *poVar5;
  mapped_type *this;
  _Base_ptr p_Var6;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *result;
  _Rb_tree_header *p_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  _Any_data local_1f8;
  code *local_1e8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_w;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var7 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
  result = &scope->visibility;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var6 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var7; p_Var6 = (_Base_ptr)::std::_Rb_tree_increment(p_Var6)) {
    __lhs = p_Var6 + 1;
    bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"visibility");
    if (bVar2) {
      ::std::__cxx11::string::string((string *)&ss_w,"visibility",(allocator *)&local_238);
      sVar4 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&table,(string *)&ss_w);
      ::std::__cxx11::string::_M_dispose();
      if (sVar4 == 0) {
        Property::value_type_name_abi_cxx11_((string *)&ss_w,(Property *)(p_Var6 + 2));
        tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
        _Var3 = ::std::operator==((string *)&ss_w,&local_238);
        if ((_Var3) && (uVar1 = *(uint *)((long)&p_Var6[0x17]._M_parent + 4), uVar1 < 2)) {
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (uVar1 == 0) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_w);
            poVar5 = ::std::operator<<((ostream *)&ss_w,"[warn]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xb16);
            ::std::operator<<(poVar5," ");
            poVar5 = ::std::operator<<((ostream *)&ss_w,"No value assigned to `");
            poVar5 = ::std::operator<<(poVar5,"visibility");
            poVar5 = ::std::operator<<(poVar5,"` token attribute. Set default token value.");
            ::std::operator<<(poVar5,"\n");
            if (warn != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_238,&local_218,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               err);
              ::std::__cxx11::string::operator=((string *)warn,(string *)&local_238);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_w);
            AttrMetas::operator=(&result->_metas,(AttrMetas *)(p_Var6 + 7));
            ::std::__cxx11::string::string((string *)&ss_w,"visibility",(allocator *)&local_238);
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&table,(string *)&ss_w);
            ::std::__cxx11::string::_M_dispose();
            goto LAB_001b050f;
          }
        }
        else {
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        _ss_w = VisibilityEnumHandler;
        ::std::__cxx11::string::string((string *)&local_238,"visibility",(allocator *)&local_218);
        bVar2 = options->strict_allowedToken_check;
        ::std::
        function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function((function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_1f8,
                   (function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&ss_w);
        bVar2 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                          (&local_238,bVar2,(EnumHandlerFun<tinyusdz::Visibility> *)&local_1f8,
                           (Attribute *)(p_Var6 + 2),result,warn,err);
        if (local_1e8 != (code *)0x0) {
          (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
        }
        ::std::__cxx11::string::_M_dispose();
        if (bVar2) {
          AttrMetas::operator=(&result->_metas,(AttrMetas *)(p_Var6 + 7));
          ::std::__cxx11::string::string((string *)&local_238,"visibility",(allocator *)&local_218);
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&table,&local_238);
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::
        _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::_M_manager((_Any_data *)&ss_w,(_Any_data *)&ss_w,__destroy_functor);
        if (!bVar2) break;
      }
    }
    else {
      sVar4 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&table,(key_type *)__lhs);
      if (sVar4 == 0) {
        this = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[](&scope->props,(key_type *)__lhs);
        Property::operator=(this,(Property *)(p_Var6 + 2));
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&table,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs);
      }
      sVar4 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&table,(key_type *)__lhs);
      if (sVar4 == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_w);
        poVar5 = ::std::operator<<((ostream *)&ss_w,"[warn]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xb18);
        ::std::operator<<(poVar5," ");
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_238,"Unsupported/unimplemented property: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs)
        ;
        poVar5 = ::std::operator<<((ostream *)&ss_w,(string *)&local_238);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::_M_dispose();
        if (warn != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_238,&local_218,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err)
          ;
          ::std::__cxx11::string::operator=((string *)warn,(string *)&local_238);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_w);
      }
    }
LAB_001b050f:
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return (_Rb_tree_header *)p_Var6 == p_Var7;
}

Assistant:

bool ReconstructPrim<Scope>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    Scope *scope,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  // `Scope` is just a namespace in scene graph(no node xform)

  (void)spec;
  (void)references;
  (void)scope;
  (void)err;
  (void)options;

  DCOUT("Scope");
  std::set<std::string> table;
  for (const auto &prop : properties) {
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, Scope,
                   scope->visibility, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, Scope, scope->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}